

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c++
# Opt level: O2

void __thiscall kj::_::Debug::Fault::~Fault(Fault *this)

{
  Exception *this_00;
  Exception copy;
  
  if (this->exception != (Exception *)0x0) {
    Exception::Exception(&copy,this->exception);
    this_00 = this->exception;
    if (this_00 != (Exception *)0x0) {
      Exception::~Exception(this_00);
    }
    operator_delete(this_00,0x158);
    throwRecoverableException(&copy,2);
    Exception::~Exception(&copy);
  }
  return;
}

Assistant:

Debug::Fault::~Fault() noexcept(false) {
  if (exception != nullptr) {
    Exception copy = mv(*exception);
    delete exception;
    throwRecoverableException(mv(copy), 2);
  }
}